

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void EV_LightTurnOnPartway(int tag,double frac)

{
  sector_t_conflict *sec;
  uint uVar1;
  int iVar2;
  sector_t_conflict *psVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  FSectorTagIterator it;
  FSectorTagIterator local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_48 = 1.0;
  if (frac <= 1.0) {
    local_48 = frac;
  }
  local_48 = (double)(-(ulong)(0.0 < frac) & (ulong)local_48);
  uStack_40 = 0;
  if (tag == 0) {
    local_50.start = 0;
  }
  else {
    local_50.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  dVar7 = 1.0 - local_48;
  local_50.searchtag = tag;
  while( true ) {
    uVar1 = FSectorTagIterator::Next(&local_50);
    if ((int)uVar1 < 0) break;
    sec = sectors + uVar1;
    iVar4 = (int)sectors[uVar1].lightlevel;
    iVar6 = 0;
    for (lVar5 = 0; lVar5 < sec->linecount; lVar5 = lVar5 + 1) {
      psVar3 = getNextSector(sec->lines[lVar5],sec);
      if (psVar3 != (sector_t_conflict *)0x0) {
        iVar2 = (int)psVar3->lightlevel;
        if (iVar6 <= iVar2) {
          iVar6 = iVar2;
        }
        if (iVar2 <= iVar4) {
          iVar4 = iVar2;
        }
      }
    }
    dVar9 = (double)iVar4 * dVar7 + (double)iVar6 * local_48;
    dVar8 = -32768.0;
    if (-32768.0 <= dVar9) {
      dVar8 = dVar9;
    }
    dVar9 = 32767.0;
    if (dVar8 <= 32767.0) {
      dVar9 = dVar8;
    }
    sec->lightlevel = (short)(int)dVar9;
  }
  return;
}

Assistant:

void EV_LightTurnOnPartway (int tag, double frac)
{
	frac = clamp(frac, 0., 1.);

	// Search all sectors for ones with same tag as activating line
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *temp, *sector = &sectors[secnum];
		int j, bright = 0, min = sector->lightlevel;

		for (j = 0; j < sector->linecount; ++j)
		{
			if ((temp = getNextSector (sector->lines[j], sector)) != NULL)
			{
				if (temp->lightlevel > bright)
				{
					bright = temp->lightlevel;
				}
				if (temp->lightlevel < min)
				{
					min = temp->lightlevel;
				}
			}
		}
		sector->SetLightLevel(int(frac * bright + (1 - frac) * min));
	}
}